

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long mkvparser::Track::Create
               (Segment *pSegment,Info *info,longlong element_start,longlong element_size,
               Track **pResult)

{
  int iVar1;
  Track *this;
  long *in_R8;
  int status;
  Track *pTrack;
  Track *dst;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  longlong in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb8;
  long local_8;
  
  if (*in_R8 == 0) {
    this = (Track *)operator_new(0xc0,(nothrow_t *)&std::nothrow);
    dst = (Track *)0x0;
    if (this != (Track *)0x0) {
      Track(this,(Segment *)CONCAT17(1,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb0,
            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      dst = this;
    }
    if (dst == (Track *)0x0) {
      local_8 = -1;
    }
    else {
      iVar1 = Info::Copy((Info *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         (Info *)dst);
      if (iVar1 == 0) {
        *in_R8 = (long)dst;
        local_8 = 0;
      }
      else {
        if (dst != (Track *)0x0) {
          (*dst->_vptr_Track[1])();
        }
        local_8 = (long)iVar1;
      }
    }
  }
  else {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

long Track::Create(Segment* pSegment, const Info& info, long long element_start,
                   long long element_size, Track*& pResult) {
  if (pResult)
    return -1;

  Track* const pTrack =
      new (std::nothrow) Track(pSegment, element_start, element_size);

  if (pTrack == NULL)
    return -1;  // generic error

  const int status = info.Copy(pTrack->m_info);

  if (status) {  // error
    delete pTrack;
    return status;
  }

  pResult = pTrack;
  return 0;  // success
}